

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O0

void __thiscall
CommandLineOption::CommandLineOption<bool>
          (CommandLineOption *this,bool *data,char shortform,char *longform,char *description)

{
  size_t sVar1;
  char *description_local;
  char *longform_local;
  char shortform_local;
  bool *data_local;
  CommandLineOption *this_local;
  
  this->_vptr_CommandLineOption = (_func_int **)&PTR__CommandLineOption_00190cc8;
  this->_shortform = shortform;
  String::String(&this->_longform,longform);
  String::String(&this->_description,description);
  this->_type = (type_info *)&bool::typeinfo;
  PointerUnion::PointerUnion((PointerUnion *)&this->_ptr,data);
  if (shortform == '\0') {
    sVar1 = strlen(longform);
    if (sVar1 == 0) {
      error<>("commandline option left without short-form or long-form name");
    }
  }
  return;
}

Assistant:

CommandLineOption (T& data, char shortform, const char* longform, const char* description) :
		_shortform (shortform),
		_longform (longform),
		_description (description),
		_type (&typeid (T)),
		_ptr (&data)
	{
		static_assert (std::is_same<T, int>::value
			or std::is_same<T, bool>::value
			or std::is_same<T, String>::value
			or std::is_same<T, double>::value
			or std::is_enum<T>::value,
			"value to CommandLineOption must be either int, bool, String or double");

		if (shortform == '\0' and not std::strlen (longform))
			error ("commandline option left without short-form or long-form name");
	}